

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InstanceArraySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          span<const_slang::ast::Symbol_*,_18446744073709551615UL> *args_3,ConstantRange *args_4)

{
  string_view name;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> elements;
  InstanceArraySymbol *this_00;
  
  this_00 = (InstanceArraySymbol *)allocate(this,0x90,8);
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  elements._M_ptr = args_3->_M_ptr;
  elements._M_extent._M_extent_value = (args_3->_M_extent)._M_extent_value;
  ast::InstanceArraySymbol::InstanceArraySymbol(this_00,args,name,*args_2,elements,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }